

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O0

int __thiscall MT32Emu::BReverbModelImpl<short>::close(BReverbModelImpl<short> *this,int __fd)

{
  uint local_18;
  uint local_14;
  Bit32u i_1;
  Bit32u i;
  BReverbModelImpl<short> *this_local;
  
  if (this->allpasses != (AllpassFilter<short> **)0x0) {
    for (local_14 = 0; local_14 < this->currentSettings->numberOfAllpasses; local_14 = local_14 + 1)
    {
      if (this->allpasses[local_14] != (AllpassFilter<short> *)0x0) {
        if (this->allpasses[local_14] != (AllpassFilter<short> *)0x0) {
          (*(this->allpasses[local_14]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
        }
        this->allpasses[local_14] = (AllpassFilter<short> *)0x0;
      }
    }
    if (this->allpasses != (AllpassFilter<short> **)0x0) {
      operator_delete__(this->allpasses);
    }
    this->allpasses = (AllpassFilter<short> **)0x0;
  }
  if (this->combs != (CombFilter<short> **)0x0) {
    for (local_18 = 0; local_18 < this->currentSettings->numberOfCombs; local_18 = local_18 + 1) {
      if (this->combs[local_18] != (CombFilter<short> *)0x0) {
        if (this->combs[local_18] != (CombFilter<short> *)0x0) {
          (*(this->combs[local_18]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
        }
        this->combs[local_18] = (CombFilter<short> *)0x0;
      }
    }
    if (this->combs != (CombFilter<short> **)0x0) {
      operator_delete__(this->combs);
    }
    this->combs = (CombFilter<short> **)0x0;
  }
  return (int)this;
}

Assistant:

void close() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				if (allpasses[i] != NULL) {
					delete allpasses[i];
					allpasses[i] = NULL;
				}
			}
			delete[] allpasses;
			allpasses = NULL;
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				if (combs[i] != NULL) {
					delete combs[i];
					combs[i] = NULL;
				}
			}
			delete[] combs;
			combs = NULL;
		}
	}